

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchMan.c
# Opt level: O2

void Dch_ManSatSolverRecycle(Dch_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Obj_t *pAVar3;
  sat_solver *psVar4;
  int i;
  long lVar5;
  int local_c;
  
  psVar4 = p->pSat;
  if (psVar4 != (sat_solver *)0x0) {
    pVVar2 = p->vUsedNodes;
    for (lVar5 = 0; lVar5 < pVVar2->nSize; lVar5 = lVar5 + 1) {
      p->pSatVars[*(int *)((long)pVVar2->pArray[lVar5] + 0x24)] = 0;
    }
    pVVar2->nSize = 0;
    sat_solver_delete(psVar4);
  }
  psVar4 = sat_solver_new();
  p->pSat = psVar4;
  sat_solver_setnvars(psVar4,1000);
  p->nSatVars = 1;
  local_c = 3 - (uint)(p->pPars->fPolarFlip == 0);
  sat_solver_addclause(p->pSat,&local_c,(lit *)&stack0xfffffffffffffff8);
  pAVar3 = p->pAigFraig->pConst1;
  iVar1 = p->nSatVars;
  p->nSatVars = iVar1 + 1;
  p->pSatVars[pAVar3->Id] = iVar1;
  p->nRecycles = p->nRecycles + 1;
  p->nCallsSince = 0;
  return;
}

Assistant:

void Dch_ManSatSolverRecycle( Dch_Man_t * p )
{
    int Lit;
    if ( p->pSat )
    {
        Aig_Obj_t * pObj;
        int i;
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vUsedNodes, pObj, i )
            Dch_ObjSetSatNum( p, pObj, 0 );
        Vec_PtrClear( p->vUsedNodes );
//        memset( p->pSatVars, 0, sizeof(int) * Aig_ManObjNumMax(p->pAigTotal) );
        sat_solver_delete( p->pSat );
    }
    p->pSat = sat_solver_new();
    sat_solver_setnvars( p->pSat, 1000 );
    // var 0 is not used
    // var 1 is reserved for const1 node - add the clause
    p->nSatVars = 1;
//    p->nSatVars = 0;
    Lit = toLit( p->nSatVars );
    if ( p->pPars->fPolarFlip )
        Lit = lit_neg( Lit );
    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    Dch_ObjSetSatNum( p, Aig_ManConst1(p->pAigFraig), p->nSatVars++ );

    p->nRecycles++;
    p->nCallsSince = 0;
}